

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void fe_cmov(fe_loose *f,fe_loose *g,fe_limb_t b)

{
  uint i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    f->v[lVar1] = (g->v[lVar1] ^ f->v[lVar1]) & -b ^ f->v[lVar1];
  }
  return;
}

Assistant:

static void fe_cmov(fe_loose *f, const fe_loose *g, fe_limb_t b) {
  // Silence an unused function warning. |fiat_25519_selectznz| isn't quite the
  // calling convention the rest of this code wants, so implement it by hand.
  //
  // TODO(davidben): Switch to fiat's calling convention, or ask fiat to emit a
  // different one.

  b = 0 - b;
  for (unsigned i = 0; i < FE_NUM_LIMBS; i++) {
    fe_limb_t x = f->v[i] ^ g->v[i];
    x &= b;
    f->v[i] ^= x;
  }
}